

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

void bcf_enc_vint(kstring_t *s,int n,int32_t *a,int wsize)

{
  int iVar1;
  int32_t iVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  size_t sVar11;
  
  if (n == 1) {
    bcf_enc_int1(s,*a);
    return;
  }
  if (n == 0) {
    uVar7 = s->l + 1;
    if (s->m <= uVar7) {
      uVar7 = uVar7 >> 1 | uVar7;
      uVar7 = uVar7 >> 2 | uVar7;
      uVar7 = uVar7 >> 4 | uVar7;
      uVar7 = uVar7 >> 8 | uVar7;
      sVar11 = (uVar7 >> 0x10 | uVar7) + 1;
      s->m = sVar11;
      pcVar8 = (char *)realloc(s->s,sVar11);
      if (pcVar8 == (char *)0x0) {
        return;
      }
      s->s = pcVar8;
    }
    sVar3 = s->l;
    s->l = sVar3 + 1;
    s->s[sVar3] = '\0';
    s->s[s->l] = '\0';
  }
  else {
    if (wsize < 1) {
      wsize = n;
    }
    if (n < 1) {
      iVar6 = 0x7fffffff;
      iVar10 = -0x7fffffff;
    }
    else {
      iVar10 = -0x7fffffff;
      iVar6 = 0x7fffffff;
      uVar7 = 0;
      do {
        iVar1 = a[uVar7];
        iVar4 = iVar1;
        if (iVar1 < iVar10) {
          iVar4 = iVar10;
        }
        iVar5 = iVar1;
        if (iVar6 < iVar1) {
          iVar5 = iVar6;
        }
        if (-0x7fffffff < iVar1) {
          iVar6 = iVar5;
          iVar10 = iVar4;
        }
        uVar7 = uVar7 + 1;
      } while ((uint)n != uVar7);
    }
    if (iVar6 < -0x7e || 0x7f < iVar10) {
      if (iVar6 < -0x7ffe || 0x7fff < iVar10) {
        bcf_enc_size(s,wsize,3);
        if (0 < n) {
          uVar7 = 0;
          do {
            iVar2 = a[uVar7];
            uVar9 = s->l + 5;
            if (uVar9 < s->m) {
LAB_0011bdb4:
              *(int32_t *)(s->s + s->l) = iVar2;
              sVar3 = s->l;
              s->l = sVar3 + 4;
              s->s[sVar3 + 4] = '\0';
            }
            else {
              uVar9 = uVar9 >> 1 | uVar9;
              uVar9 = uVar9 >> 2 | uVar9;
              uVar9 = uVar9 >> 4 | uVar9;
              uVar9 = uVar9 >> 8 | uVar9;
              sVar11 = (uVar9 >> 0x10 | uVar9) + 1;
              s->m = sVar11;
              pcVar8 = (char *)realloc(s->s,sVar11);
              if (pcVar8 != (char *)0x0) {
                s->s = pcVar8;
                goto LAB_0011bdb4;
              }
            }
            uVar7 = uVar7 + 1;
          } while ((uint)n != uVar7);
        }
      }
      else {
        bcf_enc_size(s,wsize,2);
        if (0 < n) {
          uVar7 = 0;
          do {
            iVar10 = a[uVar7];
            if (iVar10 == -0x7fffffff) {
              iVar10 = 0x8001;
            }
            uVar9 = s->l + 3;
            if (uVar9 < s->m) {
LAB_0011bd12:
              *(short *)(s->s + s->l) = (short)iVar10;
              sVar3 = s->l;
              s->l = sVar3 + 2;
              s->s[sVar3 + 2] = '\0';
            }
            else {
              uVar9 = uVar9 >> 1 | uVar9;
              uVar9 = uVar9 >> 2 | uVar9;
              uVar9 = uVar9 >> 4 | uVar9;
              uVar9 = uVar9 >> 8 | uVar9;
              sVar11 = (uVar9 >> 0x10 | uVar9) + 1;
              s->m = sVar11;
              pcVar8 = (char *)realloc(s->s,sVar11);
              if (pcVar8 != (char *)0x0) {
                s->s = pcVar8;
                goto LAB_0011bd12;
              }
            }
            uVar7 = uVar7 + 1;
          } while ((uint)n != uVar7);
        }
      }
    }
    else {
      bcf_enc_size(s,wsize,1);
      if (0 < n) {
        uVar7 = 0;
        do {
          iVar10 = a[uVar7];
          uVar9 = s->l + 1;
          if (iVar10 == -0x7fffffff) {
            iVar10 = 0x81;
          }
          if (uVar9 < s->m) {
LAB_0011bc39:
            sVar3 = s->l;
            s->l = sVar3 + 1;
            s->s[sVar3] = (char)iVar10;
            s->s[s->l] = '\0';
          }
          else {
            uVar9 = uVar9 >> 1 | uVar9;
            uVar9 = uVar9 >> 2 | uVar9;
            uVar9 = uVar9 >> 4 | uVar9;
            uVar9 = uVar9 >> 8 | uVar9;
            sVar11 = (uVar9 >> 0x10 | uVar9) + 1;
            s->m = sVar11;
            pcVar8 = (char *)realloc(s->s,sVar11);
            if (pcVar8 != (char *)0x0) {
              s->s = pcVar8;
              goto LAB_0011bc39;
            }
          }
          uVar7 = uVar7 + 1;
        } while ((uint)n != uVar7);
      }
    }
  }
  return;
}

Assistant:

void bcf_enc_vint(kstring_t *s, int n, int32_t *a, int wsize)
{
    int32_t max = INT32_MIN + 1, min = INT32_MAX;
    int i;
    if (n == 0) bcf_enc_size(s, 0, BCF_BT_NULL);
    else if (n == 1) bcf_enc_int1(s, a[0]);
    else {
        if (wsize <= 0) wsize = n;
        for (i = 0; i < n; ++i) {
            if (a[i] == bcf_int32_missing || a[i] == bcf_int32_vector_end ) continue;
            if (max < a[i]) max = a[i];
            if (min > a[i]) min = a[i];
        }
        if (max <= INT8_MAX && min > bcf_int8_vector_end) {
            bcf_enc_size(s, wsize, BCF_BT_INT8);
            for (i = 0; i < n; ++i)
                if ( a[i]==bcf_int32_vector_end ) kputc(bcf_int8_vector_end, s);
                else if ( a[i]==bcf_int32_missing ) kputc(bcf_int8_missing, s);
                else kputc(a[i], s);
        } else if (max <= INT16_MAX && min > bcf_int16_vector_end) {
            bcf_enc_size(s, wsize, BCF_BT_INT16);
            for (i = 0; i < n; ++i)
            {
                int16_t x;
                if ( a[i]==bcf_int32_vector_end ) x = bcf_int16_vector_end;
                else if ( a[i]==bcf_int32_missing ) x = bcf_int16_missing;
                else x = a[i];
                kputsn((char*)&x, 2, s);
            }
        } else {
            bcf_enc_size(s, wsize, BCF_BT_INT32);
            for (i = 0; i < n; ++i) {
                int32_t x = a[i];
                kputsn((char*)&x, 4, s);
            }
        }
    }
}